

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

void EPD_DrawEllipse(uint16_t Xpos,uint16_t Ypos,uint16_t XRadius,uint16_t YRadius,uint8_t color)

{
  uint16_t uVar1;
  uint16_t x0;
  short sVar2;
  uint16_t x0_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined6 in_register_0000000a;
  int iVar7;
  undefined6 in_register_00000012;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar7 = (int)CONCAT62(in_register_00000012,XRadius);
  iVar5 = (int)CONCAT62(in_register_0000000a,YRadius);
  iVar8 = iVar7 * -2 + 2;
  iVar6 = -iVar5;
  iVar9 = 0;
  do {
    sVar2 = (short)(int)((float)iVar9 / ((float)iVar5 / (float)iVar7));
    x0 = Xpos - sVar2;
    uVar1 = (short)iVar6 + Ypos;
    EPD_DrawPixel(x0,uVar1,color);
    x0_00 = sVar2 + Xpos;
    EPD_DrawPixel(x0_00,uVar1,color);
    uVar1 = Ypos - (short)iVar6;
    EPD_DrawPixel(x0_00,uVar1,color);
    EPD_DrawPixel(x0,uVar1,color);
    iVar4 = iVar8;
    if (iVar8 <= iVar9) {
      iVar10 = iVar9 + 1;
      iVar4 = iVar8 + 3 + iVar9 * 2;
      iVar9 = iVar10;
      if ((iVar10 + iVar6 == 0) && (iVar8 <= iVar6)) {
        iVar8 = 0;
      }
    }
    iVar3 = iVar6 + 1;
    iVar10 = iVar6 * 2 + 3;
    if (iVar8 <= iVar6) {
      iVar3 = iVar6;
      iVar10 = 0;
    }
    iVar6 = iVar3;
    iVar8 = iVar10 + iVar4;
  } while (iVar6 < 1);
  return;
}

Assistant:

void EPD_DrawEllipse(uint16_t Xpos, uint16_t Ypos, uint16_t XRadius, uint16_t YRadius, uint8_t color)
{
  int32_t x = 0, y = -YRadius, err = 2-2*XRadius, e2;
  float k = 0, rad1 = 0, rad2 = 0;
  
  rad1 = XRadius;
  rad2 = YRadius;
  
  k = (float)(rad2/rad1);  
  
  do { 
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos-y), color);
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos-y), color);      
    
    e2 = err;
    if (e2 <= x) {
      err += ++x*2+1;
      if (-y == x && e2 <= y) e2 = 0;
    }
    if (e2 > y) err += ++y*2+1;     
  }
  while (y <= 0);
}